

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predicates.c
# Opt level: O1

float orient3dslow(float *pa,float *pb,float *pc,float *pd)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int elen;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float cxay [8];
  float bxay [8];
  float axby [8];
  float cxby [8];
  float axcy [8];
  float bxcy [8];
  float temp16 [16];
  float bdet [64];
  float adet [64];
  float temp32t [32];
  float temp32 [32];
  float cdet [64];
  float deter [192];
  float abdet [128];
  float local_a38;
  float local_a34;
  float local_a30;
  float local_a2c;
  float local_a28;
  float local_a24;
  float local_a20;
  float local_a1c;
  float local_a18;
  float local_a14;
  float local_a10;
  float local_a0c;
  float local_a08;
  float local_a04;
  float local_a00;
  float local_9fc;
  float local_9f8;
  float local_9f4;
  float local_9f0;
  float local_9ec;
  float local_9e8;
  float local_9e4;
  float local_9e0;
  float local_9dc;
  float local_9d8;
  float local_9d4;
  float local_9d0;
  float local_9cc;
  float local_9c8;
  float local_9c4;
  float local_9c0;
  float local_9bc;
  float local_9b8;
  float local_9b4;
  float local_9b0;
  float local_9ac;
  float local_9a8;
  float local_9a4;
  float local_9a0;
  float local_99c;
  float local_998;
  float local_994;
  float local_990;
  float local_98c;
  float local_988;
  float local_984;
  float local_980;
  float local_97c;
  float local_978 [16];
  float local_938 [64];
  float local_838 [64];
  float local_738 [32];
  float local_6b8 [32];
  float local_638 [63];
  float afStack_53c [193];
  float local_238 [130];
  
  fVar1 = *pa;
  fVar2 = pa[1];
  fVar3 = *pd;
  fVar8 = pd[1];
  fVar44 = fVar1 - fVar3;
  fVar38 = (fVar1 - (fVar44 + (fVar1 - fVar44))) + ((fVar1 - fVar44) - fVar3);
  fVar18 = fVar2 - fVar8;
  fVar26 = (fVar2 - (fVar18 + (fVar2 - fVar18))) + ((fVar2 - fVar18) - fVar8);
  fVar1 = pa[2];
  fVar2 = pd[2];
  fVar19 = fVar1 - fVar2;
  fVar4 = *pb;
  fVar29 = pb[1];
  fVar20 = fVar4 - fVar3;
  fVar27 = (fVar4 - (fVar20 + (fVar4 - fVar20))) + ((fVar4 - fVar20) - fVar3);
  fVar28 = fVar29 - fVar8;
  fVar40 = (fVar29 - (fVar28 + (fVar29 - fVar28))) + ((fVar29 - fVar28) - fVar8);
  fVar4 = pb[2];
  fVar21 = fVar4 - fVar2;
  fVar29 = *pc;
  fVar22 = fVar29 - fVar3;
  fVar29 = (fVar29 - (fVar22 + (fVar29 - fVar22))) + ((fVar29 - fVar22) - fVar3);
  fVar3 = pc[1];
  fVar13 = fVar3 - fVar8;
  fVar30 = (fVar3 - (fVar13 + (fVar3 - fVar13))) + ((fVar3 - fVar13) - fVar8);
  fVar3 = pc[2];
  fVar9 = fVar3 - fVar2;
  fVar10 = fVar38 * splitter - (fVar38 * splitter - fVar38);
  fVar11 = splitter * fVar40 - (splitter * fVar40 - fVar40);
  fVar8 = fVar38 * fVar40;
  fVar23 = fVar38 - fVar10;
  fVar12 = fVar40 - fVar11;
  local_9f8 = fVar23 * fVar12 - (((fVar8 - fVar10 * fVar11) - fVar23 * fVar11) - fVar10 * fVar12);
  fVar35 = fVar44 * splitter - (fVar44 * splitter - fVar44);
  fVar14 = fVar44 * fVar40;
  fVar24 = fVar44 - fVar35;
  fVar11 = fVar12 * fVar24 - (((fVar14 - fVar35 * fVar11) - fVar11 * fVar24) - fVar35 * fVar12);
  fVar31 = fVar8 + fVar11;
  fVar8 = (fVar8 - (fVar31 - (fVar31 - fVar8))) + (fVar11 - (fVar31 - fVar8));
  fVar32 = fVar14 + fVar31;
  fVar31 = fVar31 - (fVar32 - fVar14);
  fVar15 = fVar28 * splitter - (fVar28 * splitter - fVar28);
  fVar39 = fVar38 * fVar28;
  fVar25 = fVar28 - fVar15;
  fVar11 = fVar23 * fVar25 - (((fVar39 - fVar10 * fVar15) - fVar23 * fVar15) - fVar10 * fVar25);
  fVar12 = fVar11 + fVar8;
  local_9f4 = (fVar8 - (fVar12 - (fVar12 - fVar8))) + (fVar11 - (fVar12 - fVar8));
  fVar8 = fVar31 + fVar12;
  fVar36 = (fVar31 - (fVar8 - (fVar8 - fVar31))) + (fVar12 - (fVar8 - fVar31));
  fVar37 = fVar32 + fVar8;
  fVar33 = (fVar32 - (fVar37 - (fVar37 - fVar32))) + (fVar8 - (fVar37 - fVar32));
  fVar11 = -fVar18;
  fVar12 = -fVar26;
  fVar14 = -fVar28;
  fVar41 = -fVar40;
  fVar16 = -fVar13;
  fVar31 = -fVar30;
  fVar34 = fVar38 * fVar31;
  fVar32 = fVar31 * fVar44;
  fVar38 = fVar38 * fVar16;
  fVar17 = fVar16 * fVar44;
  fVar44 = fVar44 * fVar28;
  fVar15 = fVar25 * fVar24 - (((fVar44 - fVar35 * fVar15) - fVar15 * fVar24) - fVar35 * fVar25);
  fVar8 = fVar39 + fVar15;
  fVar25 = (fVar39 - (fVar8 - (fVar8 - fVar39))) + (fVar15 - (fVar8 - fVar39));
  fVar15 = fVar25 + fVar36;
  local_9f0 = (fVar36 - (fVar15 - (fVar15 - fVar36))) + (fVar25 - (fVar15 - fVar36));
  fVar25 = fVar33 + fVar15;
  fVar39 = (fVar33 - (fVar25 - (fVar25 - fVar33))) + (fVar15 - (fVar25 - fVar33));
  fVar15 = fVar37 + fVar25;
  fVar33 = (fVar37 - (fVar15 - (fVar15 - fVar37))) + (fVar25 - (fVar15 - fVar37));
  fVar36 = fVar44 + fVar8;
  fVar44 = (fVar44 - (fVar36 - (fVar36 - fVar44))) + (fVar8 - (fVar36 - fVar44));
  fVar8 = fVar44 + fVar39;
  local_9ec = (fVar39 - (fVar8 - (fVar8 - fVar39))) + (fVar44 - (fVar8 - fVar39));
  fVar25 = fVar33 + fVar8;
  fVar33 = (fVar33 - (fVar25 - (fVar25 - fVar33))) + (fVar8 - (fVar25 - fVar33));
  fVar44 = fVar15 + fVar25;
  fVar15 = (fVar15 - (fVar44 - (fVar44 - fVar15))) + (fVar25 - (fVar44 - fVar15));
  fVar8 = fVar36 + fVar33;
  local_9e8 = (fVar33 - (fVar8 - (fVar8 - fVar33))) + (fVar36 - (fVar8 - fVar33));
  fVar25 = fVar15 + fVar8;
  local_9e4 = (fVar15 - (fVar25 - (fVar25 - fVar15))) + (fVar8 - (fVar25 - fVar15));
  local_9dc = fVar44 + fVar25;
  local_9e0 = (fVar44 - (local_9dc - (local_9dc - fVar44))) + (fVar25 - (local_9dc - fVar44));
  fVar42 = fVar27 * splitter - (fVar27 * splitter - fVar27);
  fVar44 = splitter * fVar12 - (fVar26 + splitter * fVar12);
  fVar15 = fVar27 * fVar12;
  fVar36 = fVar27 - fVar42;
  fVar8 = fVar12 - fVar44;
  local_a18 = fVar36 * fVar8 - (((fVar15 - fVar42 * fVar44) - fVar36 * fVar44) - fVar42 * fVar8);
  fVar43 = fVar20 * splitter - (fVar20 * splitter - fVar20);
  fVar12 = fVar12 * fVar20;
  fVar39 = fVar20 - fVar43;
  fVar44 = fVar8 * fVar39 - (((fVar12 - fVar43 * fVar44) - fVar44 * fVar39) - fVar43 * fVar8);
  fVar8 = fVar15 + fVar44;
  fVar44 = (fVar15 - (fVar8 - (fVar8 - fVar15))) + (fVar44 - (fVar8 - fVar15));
  fVar15 = fVar12 + fVar8;
  fVar8 = fVar8 - (fVar15 - fVar12);
  fVar37 = splitter * fVar11 - (fVar18 + splitter * fVar11);
  fVar33 = fVar27 * fVar11;
  fVar12 = fVar11 - fVar37;
  fVar45 = fVar36 * fVar12 - (((fVar33 - fVar42 * fVar37) - fVar36 * fVar37) - fVar42 * fVar12);
  fVar25 = fVar45 + fVar44;
  local_a14 = (fVar44 - (fVar25 - (fVar25 - fVar44))) + (fVar45 - (fVar25 - fVar44));
  fVar44 = fVar8 + fVar25;
  fVar8 = (fVar8 - (fVar44 - (fVar44 - fVar8))) + (fVar25 - (fVar44 - fVar8));
  fVar45 = fVar15 + fVar44;
  fVar15 = (fVar15 - (fVar45 - (fVar45 - fVar15))) + (fVar44 - (fVar45 - fVar15));
  fVar11 = fVar11 * fVar20;
  fVar12 = fVar12 * fVar39 - (((fVar11 - fVar43 * fVar37) - fVar37 * fVar39) - fVar43 * fVar12);
  fVar25 = fVar33 + fVar12;
  fVar44 = (fVar33 - (fVar25 - (fVar25 - fVar33))) + (fVar12 - (fVar25 - fVar33));
  fVar12 = fVar44 + fVar8;
  local_a10 = (fVar8 - (fVar12 - (fVar12 - fVar8))) + (fVar44 - (fVar12 - fVar8));
  fVar44 = fVar15 + fVar12;
  fVar15 = (fVar15 - (fVar44 - (fVar44 - fVar15))) + (fVar12 - (fVar44 - fVar15));
  fVar8 = fVar45 + fVar44;
  fVar33 = (fVar45 - (fVar8 - (fVar8 - fVar45))) + (fVar44 - (fVar8 - fVar45));
  fVar12 = fVar11 + fVar25;
  fVar44 = (fVar11 - (fVar12 - (fVar12 - fVar11))) + (fVar25 - (fVar12 - fVar11));
  fVar11 = fVar44 + fVar15;
  local_a0c = (fVar15 - (fVar11 - (fVar11 - fVar15))) + (fVar44 - (fVar11 - fVar15));
  fVar15 = fVar33 + fVar11;
  fVar11 = (fVar33 - (fVar15 - (fVar15 - fVar33))) + (fVar11 - (fVar15 - fVar33));
  fVar44 = fVar8 + fVar15;
  fVar8 = (fVar8 - (fVar44 - (fVar44 - fVar8))) + (fVar15 - (fVar44 - fVar8));
  fVar15 = fVar12 + fVar11;
  local_a08 = (fVar11 - (fVar15 - (fVar15 - fVar11))) + (fVar12 - (fVar15 - fVar11));
  fVar11 = fVar8 + fVar15;
  local_a04 = (fVar8 - (fVar11 - (fVar11 - fVar8))) + (fVar15 - (fVar11 - fVar8));
  local_9fc = fVar44 + fVar11;
  local_a00 = (fVar44 - (local_9fc - (local_9fc - fVar44))) + (fVar11 - (local_9fc - fVar44));
  fVar12 = splitter * fVar30 - (splitter * fVar30 - fVar30);
  fVar11 = fVar27 * fVar30;
  fVar8 = fVar30 - fVar12;
  local_998 = fVar36 * fVar8 - (((fVar11 - fVar42 * fVar12) - fVar36 * fVar12) - fVar42 * fVar8);
  fVar44 = fVar20 * fVar30;
  fVar8 = fVar8 * fVar39 - (((fVar44 - fVar43 * fVar12) - fVar12 * fVar39) - fVar43 * fVar8);
  fVar12 = fVar11 + fVar8;
  fVar11 = (fVar11 - (fVar12 - (fVar12 - fVar11))) + (fVar8 - (fVar12 - fVar11));
  fVar8 = fVar44 + fVar12;
  fVar12 = fVar12 - (fVar8 - fVar44);
  fVar25 = fVar13 * splitter - (fVar13 * splitter - fVar13);
  fVar27 = fVar27 * fVar13;
  fVar44 = fVar13 - fVar25;
  fVar33 = fVar36 * fVar44 - (((fVar27 - fVar42 * fVar25) - fVar36 * fVar25) - fVar42 * fVar44);
  fVar15 = fVar33 + fVar11;
  local_994 = (fVar11 - (fVar15 - (fVar15 - fVar11))) + (fVar33 - (fVar15 - fVar11));
  fVar33 = fVar12 + fVar15;
  fVar12 = (fVar12 - (fVar33 - (fVar33 - fVar12))) + (fVar15 - (fVar33 - fVar12));
  fVar11 = fVar8 + fVar33;
  fVar8 = (fVar8 - (fVar11 - (fVar11 - fVar8))) + (fVar33 - (fVar11 - fVar8));
  fVar20 = fVar20 * fVar13;
  fVar44 = fVar44 * fVar39 - (((fVar20 - fVar43 * fVar25) - fVar25 * fVar39) - fVar43 * fVar44);
  fVar15 = fVar27 + fVar44;
  fVar25 = (fVar27 - (fVar15 - (fVar15 - fVar27))) + (fVar44 - (fVar15 - fVar27));
  fVar44 = fVar25 + fVar12;
  local_990 = (fVar12 - (fVar44 - (fVar44 - fVar12))) + (fVar25 - (fVar44 - fVar12));
  fVar25 = fVar8 + fVar44;
  fVar8 = (fVar8 - (fVar25 - (fVar25 - fVar8))) + (fVar44 - (fVar25 - fVar8));
  fVar12 = fVar11 + fVar25;
  fVar11 = (fVar11 - (fVar12 - (fVar12 - fVar11))) + (fVar25 - (fVar12 - fVar11));
  fVar44 = fVar20 + fVar15;
  fVar25 = (fVar20 - (fVar44 - (fVar44 - fVar20))) + (fVar15 - (fVar44 - fVar20));
  fVar15 = fVar25 + fVar8;
  local_98c = (fVar8 - (fVar15 - (fVar15 - fVar8))) + (fVar25 - (fVar15 - fVar8));
  fVar25 = fVar11 + fVar15;
  fVar11 = (fVar11 - (fVar25 - (fVar25 - fVar11))) + (fVar15 - (fVar25 - fVar11));
  fVar8 = fVar12 + fVar25;
  fVar12 = (fVar12 - (fVar8 - (fVar8 - fVar12))) + (fVar25 - (fVar8 - fVar12));
  fVar15 = fVar44 + fVar11;
  local_988 = (fVar11 - (fVar15 - (fVar15 - fVar11))) + (fVar44 - (fVar15 - fVar11));
  fVar11 = fVar12 + fVar15;
  local_984 = (fVar12 - (fVar11 - (fVar11 - fVar12))) + (fVar15 - (fVar11 - fVar12));
  local_97c = fVar8 + fVar11;
  local_980 = (fVar8 - (local_97c - (local_97c - fVar8))) + (fVar11 - (local_97c - fVar8));
  fVar36 = splitter * fVar29 - (splitter * fVar29 - fVar29);
  fVar44 = splitter * fVar41 - (fVar40 + splitter * fVar41);
  fVar12 = fVar29 * fVar41;
  fVar11 = fVar29 - fVar36;
  fVar8 = fVar41 - fVar44;
  local_9d8 = fVar11 * fVar8 - (((fVar12 - fVar36 * fVar44) - fVar11 * fVar44) - fVar36 * fVar8);
  fVar20 = fVar22 * splitter - (fVar22 * splitter - fVar22);
  fVar41 = fVar41 * fVar22;
  fVar37 = fVar22 - fVar20;
  fVar8 = fVar8 * fVar37 - (((fVar41 - fVar20 * fVar44) - fVar44 * fVar37) - fVar20 * fVar8);
  fVar15 = fVar12 + fVar8;
  fVar44 = (fVar12 - (fVar15 - (fVar15 - fVar12))) + (fVar8 - (fVar15 - fVar12));
  fVar12 = fVar41 + fVar15;
  fVar15 = fVar15 - (fVar12 - fVar41);
  fVar8 = splitter * fVar14 - (fVar28 + splitter * fVar14);
  fVar25 = fVar29 * fVar14;
  fVar27 = fVar14 - fVar8;
  fVar33 = fVar11 * fVar27 - (((fVar25 - fVar36 * fVar8) - fVar11 * fVar8) - fVar36 * fVar27);
  fVar28 = fVar33 + fVar44;
  local_9d4 = (fVar44 - (fVar28 - (fVar28 - fVar44))) + (fVar33 - (fVar28 - fVar44));
  fVar33 = fVar15 + fVar28;
  fVar15 = (fVar15 - (fVar33 - (fVar33 - fVar15))) + (fVar28 - (fVar33 - fVar15));
  fVar44 = fVar12 + fVar33;
  fVar12 = (fVar12 - (fVar44 - (fVar44 - fVar12))) + (fVar33 - (fVar44 - fVar12));
  fVar14 = fVar14 * fVar22;
  fVar8 = fVar27 * fVar37 - (((fVar14 - fVar20 * fVar8) - fVar8 * fVar37) - fVar20 * fVar27);
  fVar28 = fVar25 + fVar8;
  fVar8 = (fVar25 - (fVar28 - (fVar28 - fVar25))) + (fVar8 - (fVar28 - fVar25));
  fVar27 = fVar8 + fVar15;
  local_9d0 = (fVar15 - (fVar27 - (fVar27 - fVar15))) + (fVar8 - (fVar27 - fVar15));
  fVar25 = fVar12 + fVar27;
  fVar8 = (fVar12 - (fVar25 - (fVar25 - fVar12))) + (fVar27 - (fVar25 - fVar12));
  fVar15 = fVar44 + fVar25;
  fVar12 = (fVar44 - (fVar15 - (fVar15 - fVar44))) + (fVar25 - (fVar15 - fVar44));
  fVar44 = fVar14 + fVar28;
  fVar25 = (fVar14 - (fVar44 - (fVar44 - fVar14))) + (fVar28 - (fVar44 - fVar14));
  fVar14 = fVar25 + fVar8;
  local_9cc = (fVar8 - (fVar14 - (fVar14 - fVar8))) + (fVar25 - (fVar14 - fVar8));
  fVar25 = fVar12 + fVar14;
  fVar12 = (fVar12 - (fVar25 - (fVar25 - fVar12))) + (fVar14 - (fVar25 - fVar12));
  fVar8 = fVar15 + fVar25;
  fVar14 = (fVar15 - (fVar8 - (fVar8 - fVar15))) + (fVar25 - (fVar8 - fVar15));
  fVar15 = fVar44 + fVar12;
  local_9c8 = (fVar12 - (fVar15 - (fVar15 - fVar12))) + (fVar44 - (fVar15 - fVar12));
  fVar12 = fVar14 + fVar15;
  local_9c4 = (fVar14 - (fVar12 - (fVar12 - fVar14))) + (fVar15 - (fVar12 - fVar14));
  local_9bc = fVar8 + fVar12;
  local_9c0 = (fVar8 - (local_9bc - (local_9bc - fVar8))) + (fVar12 - (local_9bc - fVar8));
  fVar14 = fVar26 * splitter - (fVar26 * splitter - fVar26);
  fVar12 = fVar26 * fVar29;
  fVar8 = fVar26 - fVar14;
  local_a38 = fVar11 * fVar8 - (((fVar12 - fVar36 * fVar14) - fVar11 * fVar14) - fVar36 * fVar8);
  fVar26 = fVar26 * fVar22;
  fVar8 = fVar8 * fVar37 - (((fVar26 - fVar20 * fVar14) - fVar14 * fVar37) - fVar20 * fVar8);
  fVar14 = fVar12 + fVar8;
  fVar44 = (fVar12 - (fVar14 - (fVar14 - fVar12))) + (fVar8 - (fVar14 - fVar12));
  fVar12 = fVar26 + fVar14;
  fVar14 = fVar14 - (fVar12 - fVar26);
  fVar15 = fVar18 * splitter - (fVar18 * splitter - fVar18);
  fVar29 = fVar29 * fVar18;
  fVar22 = fVar22 * fVar18;
  fVar18 = fVar18 - fVar15;
  fVar8 = fVar11 * fVar18 - (((fVar29 - fVar36 * fVar15) - fVar11 * fVar15) - fVar36 * fVar18);
  fVar11 = fVar8 + fVar44;
  local_a34 = (fVar44 - (fVar11 - (fVar11 - fVar44))) + (fVar8 - (fVar11 - fVar44));
  fVar8 = fVar14 + fVar11;
  fVar14 = (fVar14 - (fVar8 - (fVar8 - fVar14))) + (fVar11 - (fVar8 - fVar14));
  fVar11 = fVar12 + fVar8;
  fVar12 = (fVar12 - (fVar11 - (fVar11 - fVar12))) + (fVar8 - (fVar11 - fVar12));
  fVar8 = fVar18 * fVar37 - (((fVar22 - fVar20 * fVar15) - fVar15 * fVar37) - fVar20 * fVar18);
  fVar44 = fVar29 + fVar8;
  fVar29 = (fVar29 - (fVar44 - (fVar44 - fVar29))) + (fVar8 - (fVar44 - fVar29));
  fVar8 = fVar29 + fVar14;
  local_a30 = (fVar14 - (fVar8 - (fVar8 - fVar14))) + (fVar29 - (fVar8 - fVar14));
  fVar29 = fVar12 + fVar8;
  fVar12 = (fVar12 - (fVar29 - (fVar29 - fVar12))) + (fVar8 - (fVar29 - fVar12));
  fVar8 = fVar11 + fVar29;
  fVar29 = (fVar11 - (fVar8 - (fVar8 - fVar11))) + (fVar29 - (fVar8 - fVar11));
  fVar14 = fVar22 + fVar44;
  fVar44 = (fVar22 - (fVar14 - (fVar14 - fVar22))) + (fVar44 - (fVar14 - fVar22));
  fVar11 = fVar44 + fVar12;
  local_a2c = (fVar12 - (fVar11 - (fVar11 - fVar12))) + (fVar44 - (fVar11 - fVar12));
  fVar12 = fVar29 + fVar11;
  fVar29 = (fVar29 - (fVar12 - (fVar12 - fVar29))) + (fVar11 - (fVar12 - fVar29));
  fVar11 = fVar8 + fVar12;
  fVar8 = (fVar8 - (fVar11 - (fVar11 - fVar8))) + (fVar12 - (fVar11 - fVar8));
  fVar12 = fVar14 + fVar29;
  local_a28 = (fVar29 - (fVar12 - (fVar12 - fVar29))) + (fVar14 - (fVar12 - fVar29));
  fVar29 = fVar8 + fVar12;
  local_a24 = (fVar8 - (fVar29 - (fVar29 - fVar8))) + (fVar12 - (fVar29 - fVar8));
  local_a1c = fVar11 + fVar29;
  local_a20 = (fVar11 - (local_a1c - (local_a1c - fVar11))) + (fVar29 - (local_a1c - fVar11));
  fVar8 = splitter * fVar31 - (fVar30 + splitter * fVar31);
  fVar31 = fVar31 - fVar8;
  local_9b8 = fVar23 * fVar31 - (((fVar34 - fVar10 * fVar8) - fVar23 * fVar8) - fVar10 * fVar31);
  fVar8 = fVar31 * fVar24 - (((fVar32 - fVar35 * fVar8) - fVar8 * fVar24) - fVar35 * fVar31);
  fVar11 = fVar34 + fVar8;
  fVar12 = (fVar34 - (fVar11 - (fVar11 - fVar34))) + (fVar8 - (fVar11 - fVar34));
  fVar8 = fVar32 + fVar11;
  fVar11 = fVar11 - (fVar8 - fVar32);
  fVar14 = splitter * fVar16 - (fVar13 + splitter * fVar16);
  fVar16 = fVar16 - fVar14;
  fVar10 = fVar23 * fVar16 - (((fVar38 - fVar10 * fVar14) - fVar23 * fVar14) - fVar10 * fVar16);
  fVar29 = fVar10 + fVar12;
  local_9b4 = (fVar12 - (fVar29 - (fVar29 - fVar12))) + (fVar10 - (fVar29 - fVar12));
  fVar12 = fVar11 + fVar29;
  fVar10 = (fVar11 - (fVar12 - (fVar12 - fVar11))) + (fVar29 - (fVar12 - fVar11));
  fVar29 = fVar8 + fVar12;
  fVar8 = (fVar8 - (fVar29 - (fVar29 - fVar8))) + (fVar12 - (fVar29 - fVar8));
  fVar12 = fVar16 * fVar24 - (((fVar17 - fVar35 * fVar14) - fVar14 * fVar24) - fVar35 * fVar16);
  fVar11 = fVar38 + fVar12;
  fVar12 = (fVar38 - (fVar11 - (fVar11 - fVar38))) + (fVar12 - (fVar11 - fVar38));
  fVar38 = fVar12 + fVar10;
  local_9b0 = (fVar10 - (fVar38 - (fVar38 - fVar10))) + (fVar12 - (fVar38 - fVar10));
  fVar10 = fVar8 + fVar38;
  fVar8 = (fVar8 - (fVar10 - (fVar10 - fVar8))) + (fVar38 - (fVar10 - fVar8));
  fVar38 = fVar29 + fVar10;
  fVar29 = (fVar29 - (fVar38 - (fVar38 - fVar29))) + (fVar10 - (fVar38 - fVar29));
  fVar12 = fVar17 + fVar11;
  fVar11 = (fVar17 - (fVar12 - (fVar12 - fVar17))) + (fVar11 - (fVar12 - fVar17));
  fVar10 = fVar11 + fVar8;
  local_9ac = (fVar8 - (fVar10 - (fVar10 - fVar8))) + (fVar11 - (fVar10 - fVar8));
  fVar11 = fVar29 + fVar10;
  fVar29 = (fVar29 - (fVar11 - (fVar11 - fVar29))) + (fVar10 - (fVar11 - fVar29));
  fVar8 = fVar38 + fVar11;
  fVar38 = (fVar38 - (fVar8 - (fVar8 - fVar38))) + (fVar11 - (fVar8 - fVar38));
  fVar10 = fVar12 + fVar29;
  local_9a8 = (fVar29 - (fVar10 - (fVar10 - fVar29))) + (fVar12 - (fVar10 - fVar29));
  fVar29 = fVar38 + fVar10;
  local_9a4 = (fVar38 - (fVar29 - (fVar29 - fVar38))) + (fVar10 - (fVar29 - fVar38));
  local_99c = fVar8 + fVar29;
  local_9a0 = (fVar8 - (local_99c - (local_99c - fVar8))) + (fVar29 - (local_99c - fVar8));
  iVar5 = fast_expansion_sum_zeroelim(8,&local_998,8,&local_9d8,local_978);
  iVar6 = scale_expansion_zeroelim(iVar5,local_978,SUB84((double)fVar19,0),local_6b8);
  iVar5 = scale_expansion_zeroelim
                    (iVar5,local_978,
                     SUB84((double)((fVar1 - (fVar19 + (fVar1 - fVar19))) +
                                   ((fVar1 - fVar19) - fVar2)),0),local_738);
  iVar5 = fast_expansion_sum_zeroelim(iVar6,local_6b8,iVar5,local_738,local_838);
  iVar6 = fast_expansion_sum_zeroelim(8,&local_a38,8,&local_9b8,local_978);
  iVar7 = scale_expansion_zeroelim(iVar6,local_978,SUB84((double)fVar21,0),local_6b8);
  iVar6 = scale_expansion_zeroelim
                    (iVar6,local_978,
                     SUB84((double)((fVar4 - (fVar21 + (fVar4 - fVar21))) +
                                   ((fVar4 - fVar21) - fVar2)),0),local_738);
  iVar6 = fast_expansion_sum_zeroelim(iVar7,local_6b8,iVar6,local_738,local_938);
  iVar7 = fast_expansion_sum_zeroelim(8,&local_9f8,8,&local_a18,local_978);
  elen = scale_expansion_zeroelim(iVar7,local_978,SUB84((double)fVar9,0),local_6b8);
  iVar7 = scale_expansion_zeroelim
                    (iVar7,local_978,
                     SUB84((double)((fVar3 - (fVar9 + (fVar3 - fVar9))) + ((fVar3 - fVar9) - fVar2))
                           ,0),local_738);
  iVar7 = fast_expansion_sum_zeroelim(elen,local_6b8,iVar7,local_738,local_638);
  iVar5 = fast_expansion_sum_zeroelim(iVar5,local_838,iVar6,local_938,local_238);
  iVar5 = fast_expansion_sum_zeroelim(iVar5,local_238,iVar7,local_638,afStack_53c + 1);
  return afStack_53c[iVar5];
}

Assistant:

REAL orient3dslow(pa, pb, pc, pd)
REAL *pa;
REAL *pb;
REAL *pc;
REAL *pd;
{
  INEXACT REAL adx, ady, adz, bdx, bdy, bdz, cdx, cdy, cdz;
  REAL adxtail, adytail, adztail;
  REAL bdxtail, bdytail, bdztail;
  REAL cdxtail, cdytail, cdztail;
  REAL negate, negatetail;
  INEXACT REAL axby7, bxcy7, axcy7, bxay7, cxby7, cxay7;
  REAL axby[8], bxcy[8], axcy[8], bxay[8], cxby[8], cxay[8];
  REAL temp16[16], temp32[32], temp32t[32];
  int temp16len, temp32len, temp32tlen;
  REAL adet[64], bdet[64], cdet[64];
  int alen, blen, clen;
  REAL abdet[128];
  int ablen;
  REAL deter[192];
  int deterlen;

  INEXACT REAL bvirt;
  REAL avirt, bround, around;
  INEXACT REAL c;
  INEXACT REAL abig;
  REAL a0hi, a0lo, a1hi, a1lo, bhi, blo;
  REAL err1, err2, err3;
  INEXACT REAL _i, _j, _k, _l, _m, _n;
  REAL _0, _1, _2;

  Two_Diff(pa[0], pd[0], adx, adxtail);
  Two_Diff(pa[1], pd[1], ady, adytail);
  Two_Diff(pa[2], pd[2], adz, adztail);
  Two_Diff(pb[0], pd[0], bdx, bdxtail);
  Two_Diff(pb[1], pd[1], bdy, bdytail);
  Two_Diff(pb[2], pd[2], bdz, bdztail);
  Two_Diff(pc[0], pd[0], cdx, cdxtail);
  Two_Diff(pc[1], pd[1], cdy, cdytail);
  Two_Diff(pc[2], pd[2], cdz, cdztail);

  Two_Two_Product(adx, adxtail, bdy, bdytail,
                  axby7, axby[6], axby[5], axby[4],
                  axby[3], axby[2], axby[1], axby[0]);
  axby[7] = axby7;
  negate = -ady;
  negatetail = -adytail;
  Two_Two_Product(bdx, bdxtail, negate, negatetail,
                  bxay7, bxay[6], bxay[5], bxay[4],
                  bxay[3], bxay[2], bxay[1], bxay[0]);
  bxay[7] = bxay7;
  Two_Two_Product(bdx, bdxtail, cdy, cdytail,
                  bxcy7, bxcy[6], bxcy[5], bxcy[4],
                  bxcy[3], bxcy[2], bxcy[1], bxcy[0]);
  bxcy[7] = bxcy7;
  negate = -bdy;
  negatetail = -bdytail;
  Two_Two_Product(cdx, cdxtail, negate, negatetail,
                  cxby7, cxby[6], cxby[5], cxby[4],
                  cxby[3], cxby[2], cxby[1], cxby[0]);
  cxby[7] = cxby7;
  Two_Two_Product(cdx, cdxtail, ady, adytail,
                  cxay7, cxay[6], cxay[5], cxay[4],
                  cxay[3], cxay[2], cxay[1], cxay[0]);
  cxay[7] = cxay7;
  negate = -cdy;
  negatetail = -cdytail;
  Two_Two_Product(adx, adxtail, negate, negatetail,
                  axcy7, axcy[6], axcy[5], axcy[4],
                  axcy[3], axcy[2], axcy[1], axcy[0]);
  axcy[7] = axcy7;

  temp16len = fast_expansion_sum_zeroelim(8, bxcy, 8, cxby, temp16);
  temp32len = scale_expansion_zeroelim(temp16len, temp16, adz, temp32);
  temp32tlen = scale_expansion_zeroelim(temp16len, temp16, adztail, temp32t);
  alen = fast_expansion_sum_zeroelim(temp32len, temp32, temp32tlen, temp32t,
                                     adet);

  temp16len = fast_expansion_sum_zeroelim(8, cxay, 8, axcy, temp16);
  temp32len = scale_expansion_zeroelim(temp16len, temp16, bdz, temp32);
  temp32tlen = scale_expansion_zeroelim(temp16len, temp16, bdztail, temp32t);
  blen = fast_expansion_sum_zeroelim(temp32len, temp32, temp32tlen, temp32t,
                                     bdet);

  temp16len = fast_expansion_sum_zeroelim(8, axby, 8, bxay, temp16);
  temp32len = scale_expansion_zeroelim(temp16len, temp16, cdz, temp32);
  temp32tlen = scale_expansion_zeroelim(temp16len, temp16, cdztail, temp32t);
  clen = fast_expansion_sum_zeroelim(temp32len, temp32, temp32tlen, temp32t,
                                     cdet);

  ablen = fast_expansion_sum_zeroelim(alen, adet, blen, bdet, abdet);
  deterlen = fast_expansion_sum_zeroelim(ablen, abdet, clen, cdet, deter);

  return deter[deterlen - 1];
}